

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void reindexTable(Parse *pParse,Table *pTab,char *zColl)

{
  ushort uVar1;
  Index *pIndex;
  int iVar2;
  int i;
  ulong uVar3;
  Index **ppIVar4;
  
  if (pTab->eTabType != '\x01') {
    ppIVar4 = &pTab->pIndex;
    while (pIndex = *ppIVar4, pIndex != (Index *)0x0) {
      if (zColl == (char *)0x0) {
LAB_001b7d3b:
        iVar2 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
        sqlite3BeginWriteOperation(pParse,0,iVar2);
        sqlite3RefillIndex(pParse,pIndex,-1);
      }
      else {
        uVar1 = pIndex->nColumn;
        for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
          if ((-1 < pIndex->aiColumn[uVar3]) &&
             (iVar2 = sqlite3StrICmp(pIndex->azColl[uVar3],zColl), iVar2 == 0)) goto LAB_001b7d3b;
        }
      }
      ppIVar4 = &pIndex->pNext;
    }
  }
  return;
}

Assistant:

static void reindexTable(Parse *pParse, Table *pTab, char const *zColl){
  if( !IsVirtual(pTab) ){
    Index *pIndex;              /* An index associated with pTab */

    for(pIndex=pTab->pIndex; pIndex; pIndex=pIndex->pNext){
      if( zColl==0 || collationMatch(zColl, pIndex) ){
        int iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
        sqlite3BeginWriteOperation(pParse, 0, iDb);
        sqlite3RefillIndex(pParse, pIndex, -1);
      }
    }
  }
}